

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_geometry_device.cpp
# Opt level: O0

void device_init(char *cfg)

{
  LazyGeometry *pLVar1;
  float fVar2;
  float a;
  int i;
  float in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined8 uVar3;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int iVar4;
  ulong local_118;
  ulong uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  float local_f8;
  int local_f4;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ulong *local_d8;
  undefined4 local_cc;
  undefined8 *local_c8;
  undefined4 local_bc;
  undefined8 *local_b8;
  float local_ac;
  undefined4 local_a8;
  float local_a4;
  ulong *local_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  ulong *puStack_80;
  undefined8 *local_78;
  undefined8 *local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  ulong local_28;
  ulong uStack_20;
  float local_10;
  undefined4 local_c;
  float local_8;
  undefined4 local_4;
  int userID;
  
  embree::g_scene = rtcNewScene(g_device);
  embree::createGroundPlane((RTCScene)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0))
  ;
  for (local_f4 = 0; local_f4 < 0x40; local_f4 = local_f4 + 1) {
    local_f8 = (float)local_f4 * 6.2831855 * 0.015625;
    uVar3 = embree::g_scene;
    iVar4 = local_f4;
    fVar2 = cosf(local_f8);
    userID = (int)((ulong)uVar3 >> 0x20);
    local_ac = sinf(local_f8);
    local_d8 = &local_118;
    local_a8 = 0;
    local_4 = 0;
    local_c = 0;
    local_28 = (ulong)(uint)fVar2;
    uStack_20 = (ulong)(uint)local_ac;
    local_c8 = &local_108;
    local_cc = 0x41200000;
    local_b8 = &local_e8;
    local_bc = 0x41200000;
    local_88 = 0x41200000;
    local_98 = 0x41200000;
    uStack_94 = 0x41200000;
    uStack_90 = 0x41200000;
    uStack_8c = 0x41200000;
    local_e8 = 0x4120000041200000;
    uStack_e0 = 0x4120000041200000;
    local_70 = &local_108;
    local_78 = &local_e8;
    local_38 = 0x4120000041200000;
    uStack_30 = 0x4120000041200000;
    local_48._0_4_ = (float)local_118;
    local_48._4_4_ = (float)(local_118 >> 0x20);
    uStack_40._0_4_ = (float)uStack_110;
    uStack_40._4_4_ = (float)(uStack_110 >> 0x20);
    local_68 = (float)local_48 * 10.0;
    fStack_64 = local_48._4_4_ * 10.0;
    fStack_60 = (float)uStack_40 * 10.0;
    fStack_5c = uStack_40._4_4_ * 10.0;
    local_50 = &local_108;
    local_108 = CONCAT44(fStack_64,local_68);
    uStack_100 = CONCAT44(fStack_5c,fStack_60);
    local_a4 = fVar2;
    local_a0 = local_d8;
    puStack_80 = local_d8;
    local_48 = local_118;
    uStack_40 = uStack_110;
    local_10 = fVar2;
    local_8 = local_ac;
    local_118 = local_28;
    uStack_110 = uStack_20;
    pLVar1 = embree::createLazyObject
                       ((RTCScene)CONCAT44(iVar4,in_stack_fffffffffffffee0),userID,
                        (Vec3fa *)CONCAT44(fVar2,in_stack_fffffffffffffed0),
                        in_stack_fffffffffffffecc);
    *(LazyGeometry **)(embree::g_objects + (long)local_f4 * 8) = pLVar1;
  }
  rtcCommitScene(embree::g_scene);
  return;
}

Assistant:

void device_init (char* cfg)
{
  /* create scene */
  g_scene = rtcNewScene(g_device);
  
  /* instantiate geometry */
  createGroundPlane(g_scene);
  for (int i=0; i<numSpheres; i++) {
    float a = 2.0f*float(M_PI)*(float)i/(float)numSpheres;
    g_objects[i] = createLazyObject(g_scene,i,10.0f*Vec3fa(cosf(a),0,sinf(a)),1);
  }
  rtcCommitScene (g_scene);
}